

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memutil.cc
# Opt level: O0

int absl::lts_20250127::strings_internal::memcasecmp(char *s1,char *s2,size_t len)

{
  byte bVar1;
  byte bVar2;
  int diff;
  uchar c2;
  uchar c1;
  size_t i;
  uchar *us2;
  uchar *us1;
  size_t len_local;
  char *s2_local;
  char *s1_local;
  
  _diff = 0;
  do {
    if (len <= _diff) {
      return 0;
    }
    bVar1 = s1[_diff];
    bVar2 = s2[_diff];
    if (bVar1 != bVar2) {
      if ((0x40 < bVar1) && (bVar1 < 0x5b)) {
        bVar1 = bVar1 + 0x20;
      }
      if ((0x40 < bVar2) && (bVar2 < 0x5b)) {
        bVar2 = bVar2 + 0x20;
      }
      if ((uint)bVar1 - (uint)bVar2 != 0) {
        return (uint)bVar1 - (uint)bVar2;
      }
    }
    _diff = _diff + 1;
  } while( true );
}

Assistant:

int memcasecmp(const char* s1, const char* s2, size_t len) {
  const unsigned char* us1 = reinterpret_cast<const unsigned char*>(s1);
  const unsigned char* us2 = reinterpret_cast<const unsigned char*>(s2);

  for (size_t i = 0; i < len; i++) {
    unsigned char c1 = us1[i];
    unsigned char c2 = us2[i];
    // If bytes are the same, they will be the same when converted to lower.
    // So we only need to convert if bytes are not equal.
    // NOTE(b/308193381): We do not use `absl::ascii_tolower` here in order
    // to avoid its lookup table and improve performance.
    if (c1 != c2) {
      c1 = c1 >= 'A' && c1 <= 'Z' ? c1 - 'A' + 'a' : c1;
      c2 = c2 >= 'A' && c2 <= 'Z' ? c2 - 'A' + 'a' : c2;
      const int diff = int{c1} - int{c2};
      if (diff != 0) return diff;
    }
  }
  return 0;
}